

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O3

Storage __thiscall
de::Random::chooseWeighted<rsg::Variable::Storage,rsg::Variable::Storage_const*,float*>
          (Random *this,Storage *first,Storage *last,float *weight)

{
  int iVar1;
  Storage *pSVar2;
  Storage *pSVar3;
  long lVar4;
  Storage *pSVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pSVar3 = last;
  if (first == last) {
    deRandom_getFloat(&this->m_rnd);
  }
  else {
    fVar6 = 0.0;
    iVar1 = 1;
    lVar4 = 0;
    do {
      fVar6 = fVar6 + weight[lVar4];
      lVar4 = (long)iVar1;
      iVar1 = iVar1 + 1;
    } while (first + lVar4 != last);
    fVar7 = deRandom_getFloat(&this->m_rnd);
    if (first != last) {
      iVar1 = 1;
      lVar4 = 0;
      fVar8 = 0.0;
      pSVar2 = last;
      pSVar5 = first;
      do {
        fVar8 = fVar8 + weight[lVar4];
        pSVar3 = pSVar5;
        if (fVar6 * fVar7 + 0.0 < fVar8) break;
        if (0.0 < weight[lVar4]) {
          pSVar2 = pSVar5;
        }
        lVar4 = (long)iVar1;
        pSVar5 = first + lVar4;
        iVar1 = iVar1 + 1;
        pSVar3 = pSVar2;
      } while (pSVar5 != last);
    }
  }
  return *pSVar3;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}